

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

int remove_from_value_if_invalid_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_68;
  Am_Object local_60;
  byte local_51;
  undefined1 local_50 [7];
  bool changed;
  Am_Value v;
  Am_Object o;
  Am_Object obj;
  undefined1 local_20 [8];
  Am_Value_List values;
  Am_Object *self_local;
  
  values.item = (Am_List_Item *)self;
  Am_Object::Make_Unique(self,0x169);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20);
  pAVar2 = Am_Object::Get((Am_Object *)values.item,0x169,0);
  Am_Value_List::operator=((Am_Value_List *)local_20,pAVar2);
  Am_Object::Am_Object(&o);
  Am_Object::Am_Object((Am_Object *)&v.value);
  Am_Value::Am_Value((Am_Value *)local_50);
  local_51 = 0;
  Am_Value_List::Start((Am_Value_List *)local_20);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_20);
    Am_Object::operator=(&o,pAVar2);
    Am_Object::Am_Object(&local_60,&o);
    bVar1 = Am_Object_And_Owners_Valid_And_Visible(&local_60);
    Am_Object::~Am_Object(&local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pAVar2 = Am_Object::Peek(&o,100,0);
      Am_Value::operator=((Am_Value *)local_50,pAVar2);
      pAVar2 = Am_Object::Peek(&o,0x69,0);
      Am_Value::operator=((Am_Value *)local_50,pAVar2);
      Am_Object::Get_Owner(&local_68,(Am_Slot_Flags)&o);
      Am_Object::operator=((Am_Object *)&v.value,&local_68);
      Am_Object::~Am_Object(&local_68);
    }
    else {
      Am_Value_List::Delete((Am_Value_List *)local_20,false);
      local_51 = 1;
    }
    Am_Value_List::Next((Am_Value_List *)local_20);
  }
  if ((local_51 & 1) != 0) {
    Am_Object::Note_Changed((Am_Object *)values.item,0x169);
  }
  Am_Value::~Am_Value((Am_Value *)local_50);
  Am_Object::~Am_Object((Am_Object *)&v.value);
  Am_Object::~Am_Object(&o);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return 0;
}

Assistant:

Am_Define_Formula(int, remove_from_value_if_invalid)
{
  self.Make_Unique(Am_VALUE);
  Am_Value_List values;
  values = self.Get(Am_VALUE);
  Am_Object obj, o;
  Am_Value v;
  bool changed = false;
  for (values.Start(); !values.Last(); values.Next()) {
    obj = values.Get();
    if (!Am_Object_And_Owners_Valid_And_Visible(obj)) {
      values.Delete(false);
      changed = true;
    } else {
      //set up dependencies so this formula will be re-evaluated if
      //the object is modified
      v = obj.Peek(Am_LEFT);
      v = obj.Peek(Am_VISIBLE);
      o = obj.Get_Owner();
    }
  }
  if (changed) {
    self.Note_Changed(Am_VALUE);
  }
  return 0;
}